

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusTexRect::is_valid_val(MthdCelsiusTexRect *this)

{
  MthdCelsiusTexRect *this_local;
  
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2f) < 0) {
    this_local._7_1_ = false;
  }
  else if ((((this->super_SingleMthdTest).super_MthdTest.val & 0xffff) == 0) ||
          (0x7ff < ((this->super_SingleMthdTest).super_MthdTest.val & 0xffff))) {
    this_local._7_1_ = false;
  }
  else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x31 == 0) ||
          (0x7ff < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x31)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 16, 1))
			return false;
		if (!extr(val, 0, 16) || extr(val, 0, 16) >= 0x800)
			return false;
		if (!extr(val, 17, 15) || extr(val, 17, 15) >= 0x800)
			return false;
		return true;
	}